

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall
Js::ScriptFunctionWithInlineCache::FreeOwnInlineCaches<false>(ScriptFunctionWithInlineCache *this)

{
  uint uVar1;
  uint uVar2;
  InlineCache *this_00;
  void *buffer;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  ParseableFunctionInfo *this_01;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  ulong uVar8;
  Type TVar9;
  InlineCache *inlineCache;
  ulong uVar10;
  uint local_34;
  
  if (((this->super_ScriptFunction).hasInlineCaches == true) &&
     ((this->m_inlineCaches).ptr != (void **)0x0)) {
    uVar1 = this->inlineCacheCount;
    uVar10 = (ulong)uVar1;
    TVar9 = this->isInstInlineCacheCount;
    this_01 = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
    pSVar6 = FunctionProxy::GetScriptContext(&this_01->super_FunctionProxy);
    uVar2 = this->rootObjectLoadInlineCacheStart;
    if ((ulong)uVar2 == 0) {
      local_34 = 0;
    }
    else {
      uVar8 = 0;
      local_34 = 0;
      do {
        this_00 = (InlineCache *)(this->m_inlineCaches).ptr[uVar8];
        if (this_00 != (InlineCache *)0x0) {
          iVar5 = (*(pSVar6->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
          if ((char)iVar5 == '\0') {
            bVar4 = InlineCache::RemoveFromInvalidationList(this_00);
            local_34 = local_34 + bVar4;
            Memory::InlineCacheAllocator::Unlock(&pSVar6->inlineCacheAllocator);
            Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::Free
                      (&(pSVar6->inlineCacheAllocator).
                        super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                       ,this_00,0x20);
          }
          (this->m_inlineCaches).ptr[uVar8] = (void *)0x0;
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
    if (uVar1 < TVar9 + uVar1) {
      do {
        if ((this->m_inlineCaches).ptr[uVar10] != (void *)0x0) {
          iVar5 = (*(pSVar6->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar6);
          if ((char)iVar5 == '\0') {
            buffer = (this->m_inlineCaches).ptr[uVar10];
            Memory::CacheAllocator::Unlock(&pSVar6->isInstInlineCacheAllocator);
            Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::Free
                      (&(pSVar6->isInstInlineCacheAllocator).
                        super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>,
                       buffer,0x20);
          }
          (this->m_inlineCaches).ptr[uVar10] = (void *)0x0;
        }
        uVar10 = uVar10 + 1;
        TVar9 = TVar9 - 1;
      } while (TVar9 != 0);
    }
    if (local_34 != 0) {
      iVar5 = (*(pSVar6->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar6);
      if ((char)iVar5 != '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0x2d0,"(!isShutdown && !scriptContext->IsClosed())",
                                    "Unregistration of inlineCache should only be done if this is not shutdown or scriptContext closing."
                                   );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      ThreadContext::NotifyInlineCacheBatchUnregistered(pSVar6->threadContext,local_34);
      return;
    }
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::FreeOwnInlineCaches()
    {
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        if (this->GetHasInlineCaches() && this->m_inlineCaches)
        {
            Js::ScriptContext* scriptContext = this->GetParseableFunctionInfo()->GetScriptContext();
            uint i = 0;
            uint unregisteredInlineCacheCount = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd < totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                if (this->m_inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)(void*)this->m_inlineCaches[i];
                    if (isShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else if(!scriptContext->IsClosed())
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                    this->m_inlineCaches[i] = nullptr;
                }
            }

            i = isInstInlineCacheStart;
            for (; i < totalCacheCount; i++)
            {
                if (this->m_inlineCaches[i])
                {
                    if (isShutdown)
                    {
                        ((IsInstInlineCache*)this->m_inlineCaches[i])->Clear();
                    }
                    else if (!scriptContext->IsClosed())
                    {
                        AllocatorDelete(CacheAllocator, scriptContext->GetIsInstInlineCacheAllocator(), (IsInstInlineCache*)(void*)this->m_inlineCaches[i]);
                    }
                    this->m_inlineCaches[i] = nullptr;
                }
            }

            if (unregisteredInlineCacheCount > 0)
            {
                AssertMsg(!isShutdown && !scriptContext->IsClosed(), "Unregistration of inlineCache should only be done if this is not shutdown or scriptContext closing.");
                scriptContext->GetThreadContext()->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
            }
        }
    }